

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# learning.h
# Opt level: O0

void __thiscall
klogic::learning::
teacher<klogic::mvn,klogic::learning::sample<std::complex<double>>,klogic::learning::learn_error<std::complex<double>>>
::
learn_run<klogic::learning::learn_always<klogic::learning::sample<std::complex<double>>,std::complex<double>>>
          (teacher<klogic::mvn,klogic::learning::sample<std::complex<double>>,klogic::learning::learn_error<std::complex<double>>>
           *this,learn_always<klogic::learning::sample<std::complex<double>_>,_std::complex<double>_>
                 *picker)

{
  mvn *pmVar1;
  const_iterator this_00;
  bool bVar2;
  pointer psVar3;
  reference psVar4;
  pointer psVar5;
  cmplx local_50;
  undefined1 local_40 [8];
  desired_type actual;
  __normal_iterator<klogic::learning::sample<std::complex<double>_>_*,_std::vector<klogic::learning::sample<std::complex<double>_>,_std::allocator<klogic::learning::sample<std::complex<double>_>_>_>_>
  local_28;
  __normal_iterator<const_klogic::learning::sample<std::complex<double>_>_*,_std::vector<klogic::learning::sample<std::complex<double>_>,_std::allocator<klogic::learning::sample<std::complex<double>_>_>_>_>
  local_20;
  const_iterator i;
  learn_always<klogic::learning::sample<std::complex<double>_>,_std::complex<double>_> *picker_local
  ;
  teacher<klogic::mvn,_klogic::learning::sample<std::complex<double>_>,_klogic::learning::learn_error<std::complex<double>_>_>
  *this_local;
  
  i._M_current = (sample<std::complex<double>_> *)picker;
  local_28._M_current =
       (sample<std::complex<double>_> *)
       std::
       vector<klogic::learning::sample<std::complex<double>_>,_std::allocator<klogic::learning::sample<std::complex<double>_>_>_>
       ::begin((vector<klogic::learning::sample<std::complex<double>_>,_std::allocator<klogic::learning::sample<std::complex<double>_>_>_>
                *)this);
  __gnu_cxx::
  __normal_iterator<klogic::learning::sample<std::complex<double>>const*,std::vector<klogic::learning::sample<std::complex<double>>,std::allocator<klogic::learning::sample<std::complex<double>>>>>
  ::__normal_iterator<klogic::learning::sample<std::complex<double>>*>
            ((__normal_iterator<klogic::learning::sample<std::complex<double>>const*,std::vector<klogic::learning::sample<std::complex<double>>,std::allocator<klogic::learning::sample<std::complex<double>>>>>
              *)&local_20,&local_28);
  while( true ) {
    actual._M_value._8_8_ =
         std::
         vector<klogic::learning::sample<std::complex<double>_>,_std::allocator<klogic::learning::sample<std::complex<double>_>_>_>
         ::end((vector<klogic::learning::sample<std::complex<double>_>,_std::allocator<klogic::learning::sample<std::complex<double>_>_>_>
                *)this);
    bVar2 = __gnu_cxx::operator!=
                      (&local_20,
                       (__normal_iterator<klogic::learning::sample<std::complex<double>_>_*,_std::vector<klogic::learning::sample<std::complex<double>_>,_std::allocator<klogic::learning::sample<std::complex<double>_>_>_>_>
                        *)(actual._M_value + 8));
    if (!bVar2) break;
    pmVar1 = *(mvn **)(this + 0x18);
    psVar3 = __gnu_cxx::
             __normal_iterator<const_klogic::learning::sample<std::complex<double>_>_*,_std::vector<klogic::learning::sample<std::complex<double>_>,_std::allocator<klogic::learning::sample<std::complex<double>_>_>_>_>
             ::operator->(&local_20);
    mvn::output(pmVar1,&psVar3->input);
    this_00 = i;
    psVar4 = __gnu_cxx::
             __normal_iterator<const_klogic::learning::sample<std::complex<double>_>_*,_std::vector<klogic::learning::sample<std::complex<double>_>,_std::allocator<klogic::learning::sample<std::complex<double>_>_>_>_>
             ::operator*(&local_20);
    bVar2 = learn_always<klogic::learning::sample<std::complex<double>_>,_std::complex<double>_>::
            operator()((learn_always<klogic::learning::sample<std::complex<double>_>,_std::complex<double>_>
                        *)this_00._M_current,psVar4,(complex<double> *)local_40);
    if (bVar2) {
      pmVar1 = *(mvn **)(this + 0x18);
      psVar3 = __gnu_cxx::
               __normal_iterator<const_klogic::learning::sample<std::complex<double>_>_*,_std::vector<klogic::learning::sample<std::complex<double>_>,_std::allocator<klogic::learning::sample<std::complex<double>_>_>_>_>
               ::operator->(&local_20);
      psVar5 = __gnu_cxx::
               __normal_iterator<const_klogic::learning::sample<std::complex<double>_>_*,_std::vector<klogic::learning::sample<std::complex<double>_>,_std::allocator<klogic::learning::sample<std::complex<double>_>_>_>_>
               ::operator->(&local_20);
      learn_error<std::complex<double>_>::operator()
                ((learn_error<std::complex<double>_> *)(this + 0x20),(cmplx *)local_40,
                 &psVar5->desired);
      mvn::learn(pmVar1,&psVar3->input,&local_50,1.0,false);
    }
    __gnu_cxx::
    __normal_iterator<const_klogic::learning::sample<std::complex<double>_>_*,_std::vector<klogic::learning::sample<std::complex<double>_>,_std::allocator<klogic::learning::sample<std::complex<double>_>_>_>_>
    ::operator++(&local_20);
  }
  return;
}

Assistant:

void learn_run(SamplePicker const &picker = SamplePicker()) {
                for (typename std::vector<Sample>::const_iterator i = _samples.begin();
                        i != _samples.end(); ++i) {

                    typename Sample::desired_type actual = learner.output(i->input);

                    if (picker(*i, actual))
                        learner.learn(i->input, learn_error(actual, i->desired));
                }
            }